

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPolyhedralConvexShape.cpp
# Opt level: O2

cbtVector3 __thiscall
cbtPolyhedralConvexShape::localGetSupportingVertexWithoutMargin
          (cbtPolyhedralConvexShape *this,cbtVector3 *vec0)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  cbtVector3 *pcVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  cbtVector3 cVar12;
  cbtScalar newDot;
  cbtVector3 temp [128];
  float local_880;
  float local_87c;
  cbtVector3 local_878;
  ulong local_860;
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  cbtVector3 local_838 [128];
  undefined1 extraout_var [60];
  
  local_878 = *(cbtVector3 *)vec0->m_floats;
  auVar10._0_4_ = cbtVector3::length2(&local_878);
  auVar10._4_60_ = extraout_var;
  if (0.0001 <= auVar10._0_4_) {
    if (auVar10._0_4_ < 0.0) {
      fVar9 = sqrtf(auVar10._0_4_);
    }
    else {
      auVar11 = vsqrtss_avx(auVar10._0_16_,auVar10._0_16_);
      fVar9 = auVar11._0_4_;
    }
    fVar9 = 1.0 / fVar9;
    auVar11._0_4_ = fVar9 * local_878.m_floats[0];
    auVar11._4_4_ = fVar9 * local_878.m_floats[1];
    auVar11._8_4_ = fVar9 * 0.0;
    auVar11._12_4_ = fVar9 * 0.0;
    uVar1 = vmovlps_avx(auVar11);
    local_878.m_floats[2] = fVar9 * local_878.m_floats[2];
    local_878.m_floats[0] = (cbtScalar)(int)uVar1;
    local_878.m_floats[1] = (cbtScalar)(int)((ulong)uVar1 >> 0x20);
  }
  else {
    local_878.m_floats = SUB6416(ZEXT464(0x3f800000),0);
  }
  uVar7 = 0;
  local_880 = -1e+18;
  local_858._0_12_ = ZEXT812(0);
  local_858._12_4_ = 0;
  local_848 = local_858;
  while( true ) {
    iVar2 = (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
              _vptr_cbtCollisionShape[0x19])(this);
    iVar6 = (int)uVar7;
    if (iVar2 <= iVar6) break;
    iVar2 = (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
              _vptr_cbtCollisionShape[0x19])(this);
    uVar4 = 0x80;
    if (iVar2 - iVar6 < 0x80) {
      iVar2 = (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
                _vptr_cbtCollisionShape[0x19])(this);
      uVar4 = iVar2 - iVar6;
    }
    pcVar5 = local_838;
    local_860 = uVar7;
    for (uVar8 = 0; (~((int)uVar4 >> 0x1f) & uVar4) != uVar8; uVar8 = uVar8 + 1) {
      (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
        _vptr_cbtCollisionShape[0x1c])(this,uVar8 & 0xffffffff,pcVar5);
      pcVar5 = pcVar5 + 1;
    }
    lVar3 = cbtVector3::maxDot(&local_878,local_838,(long)(int)uVar4,&local_87c);
    if (local_880 < local_87c) {
      local_880 = local_87c;
      local_848._8_8_ = 0;
      local_848._0_8_ = *(ulong *)local_838[(int)lVar3].m_floats;
      local_858._8_8_ = 0;
      local_858._0_8_ = *(ulong *)(local_838[(int)lVar3].m_floats + 2);
    }
    uVar7 = (ulong)((int)local_860 + 0x80);
  }
  cVar12.m_floats[2] = (cbtScalar)local_858._0_4_;
  cVar12.m_floats[3] = (cbtScalar)local_858._4_4_;
  cVar12.m_floats[0] = (cbtScalar)local_848._0_4_;
  cVar12.m_floats[1] = (cbtScalar)local_848._4_4_;
  return (cbtVector3)cVar12.m_floats;
}

Assistant:

cbtVector3 cbtPolyhedralConvexShape::localGetSupportingVertexWithoutMargin(const cbtVector3& vec0) const
{
	cbtVector3 supVec(0, 0, 0);
#ifndef __SPU__
	int i;
	cbtScalar maxDot(cbtScalar(-BT_LARGE_FLOAT));

	cbtVector3 vec = vec0;
	cbtScalar lenSqr = vec.length2();
	if (lenSqr < cbtScalar(0.0001))
	{
		vec.setValue(1, 0, 0);
	}
	else
	{
		cbtScalar rlen = cbtScalar(1.) / cbtSqrt(lenSqr);
		vec *= rlen;
	}

	cbtVector3 vtx;
	cbtScalar newDot;

	for (int k = 0; k < getNumVertices(); k += 128)
	{
		cbtVector3 temp[128];
		int inner_count = MIN(getNumVertices() - k, 128);
		for (i = 0; i < inner_count; i++)
			getVertex(i, temp[i]);
		i = (int)vec.maxDot(temp, inner_count, newDot);
		if (newDot > maxDot)
		{
			maxDot = newDot;
			supVec = temp[i];
		}
	}

#endif  //__SPU__
	return supVec;
}